

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.h
# Opt level: O0

set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_> *
__thiscall
spvtools::val::ValidationState_t::GetExecutionModels(ValidationState_t *this,uint32_t entry_point)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>_>,_false>
  local_28;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>_>,_false>
  local_20;
  const_iterator it;
  uint32_t entry_point_local;
  ValidationState_t *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>_>,_false>
  ._M_cur._4_4_ = entry_point;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>_>_>_>
       ::find(&this->entry_point_to_execution_models_,
              (key_type *)
              ((long)&it.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>_>,_false>
                      ._M_cur + 4));
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>_>_>_>
       ::end(&this->entry_point_to_execution_models_);
  bVar1 = std::__detail::operator==(&local_20,&local_28);
  if (!bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>_>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>_>,_false,_false>
                           *)&local_20);
    return &pvVar2->second;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.h"
                ,0x120,
                "const std::set<spv::ExecutionModel> *spvtools::val::ValidationState_t::GetExecutionModels(uint32_t) const"
               );
}

Assistant:

const std::set<spv::ExecutionModel>* GetExecutionModels(
      uint32_t entry_point) const {
    const auto it = entry_point_to_execution_models_.find(entry_point);
    if (it == entry_point_to_execution_models_.end()) {
      assert(0);
      return nullptr;
    }
    return &it->second;
  }